

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.h
# Opt level: O0

void __thiscall rengine::AnimationManager::tick(AnimationManager *this)

{
  bool bVar1;
  reference __x;
  pointer pMVar2;
  element_type *peVar3;
  SignalEmitter *pSVar4;
  size_type sVar5;
  const_iterator local_80;
  _List_node_base *local_78;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  duration<double,_std::ratio<1L,_1L>_> local_68;
  duration<double,_std::ratio<1L,_1L>_> animTime;
  _Self local_58;
  iterator ri;
  _Self local_40;
  _Self local_38;
  iterator si;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  duration local_20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point now;
  AnimationManager *this_local;
  
  local_18.__d.__r = (duration)(this->m_nextTick).__d.__r;
  si._M_node._4_4_ = 0x10;
  now.__d.__r = (duration)(duration)this;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_28,(int *)((long)&si._M_node + 4));
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_20,&local_28);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::operator+=(&this->m_nextTick,&local_20);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
       ::begin(&this->m_scheduledAnimations);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
         ::end(&this->m_scheduledAnimations);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
           ::begin(&this->m_runningAnimations);
      while( true ) {
        animTime.__r = (rep_conflict)
                       std::__cxx11::
                       list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                       ::end(&this->m_runningAnimations);
        bVar1 = std::operator!=(&local_58,(_Self *)&animTime);
        if (!bVar1) {
          sVar5 = std::__cxx11::
                  list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                  ::size(&this->m_scheduledAnimations);
          if ((sVar5 == 0) &&
             (sVar5 = std::__cxx11::
                      list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                      ::size(&this->m_runningAnimations), sVar5 == 0)) {
            setRunning(this,false);
          }
          return;
        }
        pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                           (&local_58);
        peVar3 = std::
                 __shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar2->animation);
        bVar1 = AbstractAnimation::isRunning(peVar3);
        if (!bVar1) break;
        pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                           (&local_58);
        local_70.__r = (rep)std::chrono::operator-(&local_18,&pMVar2->start);
        std::chrono::duration<double,std::ratio<1l,1l>>::
        duration<long,std::ratio<1l,1000000000l>,void>
                  ((duration<double,std::ratio<1l,1l>> *)&local_68,&local_70);
        pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                           (&local_58);
        peVar3 = std::
                 __shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar2->animation);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_68);
        (**(code **)(*(long *)peVar3 + 0x10))();
        pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                           (&local_58);
        peVar3 = std::
                 __shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar2->animation);
        bVar1 = AbstractAnimation::isRunning(peVar3);
        if (bVar1) {
          std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator++(&local_58);
        }
        else {
          pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                             (&local_58);
          pSVar4 = (SignalEmitter *)
                   std::__shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(pMVar2->animation).
                               super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>
                             );
          Signal<>::emit(&AbstractAnimation::onCompleted,pSVar4);
          std::_List_const_iterator<rengine::AnimationManager::ManagedAnimation>::
          _List_const_iterator(&local_80,&local_58);
          local_78 = (_List_node_base *)
                     std::__cxx11::
                     list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                     ::erase(&this->m_runningAnimations,local_80);
          local_58._M_node = local_78;
        }
      }
      __assert_fail("ri->animation->isRunning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                    ,0x18d,"void rengine::AnimationManager::tick()");
    }
    pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->(&local_38)
    ;
    peVar3 = std::
             __shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar2->animation);
    bVar1 = AbstractAnimation::isRunning(peVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->(&local_38)
    ;
    bVar1 = std::chrono::operator<(&pMVar2->start,&local_18);
    if (bVar1) {
      pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                         (&local_38);
      (pMVar2->start).__d.__r = (rep)local_18.__d.__r;
      pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                         (&local_38);
      peVar3 = std::
               __shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar2->animation);
      AbstractAnimation::setRunning(peVar3,true);
      pMVar2 = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator->
                         (&local_38);
      pSVar4 = (SignalEmitter *)
               std::__shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(pMVar2->animation).
                           super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>
                         );
      Signal<>::emit(&AbstractAnimation::onStarted,pSVar4);
      __x = std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator*(&local_38);
      std::__cxx11::
      list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
      ::push_back(&this->m_runningAnimations,__x);
      std::_List_const_iterator<rengine::AnimationManager::ManagedAnimation>::_List_const_iterator
                ((_List_const_iterator<rengine::AnimationManager::ManagedAnimation> *)&ri,&local_38)
      ;
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
           ::erase(&this->m_scheduledAnimations,ri._M_node);
    }
    else {
      std::_List_iterator<rengine::AnimationManager::ManagedAnimation>::operator++(&local_38);
    }
  }
  __assert_fail("!si->animation->isRunning()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                ,0x17e,"void rengine::AnimationManager::tick()");
}

Assistant:

inline void AnimationManager::tick()
{
    // alternatively:
    // time_point now = clock::now();
    time_point now = m_nextTick;
    m_nextTick += std::chrono::milliseconds(16);

    // std::cout << "AnimationManager::tick: scheduled=" << m_scheduledAnimations.size()
    //           << ", running=" << m_runningAnimations.size() << std::endl;

    // Start pending animations if we've passed beyond its starting point.
    // ### TODO: these should probably be sorted so animations start in the right order
    auto si = m_scheduledAnimations.begin();
    while (si != m_scheduledAnimations.end()) {
        assert(!si->animation->isRunning());
        if (si->start < now) {
            // Make sure we start at t=0
            si->start = now;
            si->animation->setRunning(true);
            AbstractAnimation::onStarted.emit(si->animation.get());
            m_runningAnimations.push_back(*si);
            si = m_scheduledAnimations.erase(si);
        } else {
            ++si;
        }
    }

    auto ri = m_runningAnimations.begin();
    while (ri != m_runningAnimations.end()) {
        assert(ri->animation->isRunning());
        std::chrono::duration<double> animTime = now - ri->start;
        ri->animation->tick(animTime.count());
        if (!ri->animation->isRunning()) {
            AbstractAnimation::onCompleted.emit(ri->animation.get());
            ri = m_runningAnimations.erase(ri);
        } else {
            ++ri;
        }
    }

    if (m_scheduledAnimations.size() == 0 && m_runningAnimations.size() == 0)
        setRunning(false);
}